

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::Test::HasSameFixtureClass(void)

{
  ostream *poVar1;
  TestInfo *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  UnitTestImpl *pUVar5;
  Message *pMVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  char *TEST_name;
  AssertHelper local_50;
  char *TEST_F_name;
  char *this_test_name;
  char *first_test_name;
  pointer local_30;
  
  pUVar5 = internal::GetUnitTestImpl();
  pTVar2 = *(pUVar5->current_test_suite_->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (undefined1 *)pTVar2->fixture_class_id_;
  first_test_name = (pTVar2->name_)._M_dataplus._M_p;
  pTVar2 = pUVar5->current_test_info_;
  puVar4 = (undefined1 *)pTVar2->fixture_class_id_;
  this_test_name = (pTVar2->name_)._M_dataplus._M_p;
  if (puVar4 != puVar3) {
    if ((puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) ||
       (puVar4 == &internal::TypeIdHelper<testing::Test>::dummy_)) {
      TEST_F_name = first_test_name;
      TEST_name = this_test_name;
      if (puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) {
        TEST_F_name = this_test_name;
        TEST_name = first_test_name;
      }
      Message::Message((Message *)&local_60);
      poVar1 = (ostream *)(local_60._M_head_impl + 0x10);
      std::operator<<(poVar1,"All tests in the same test suite must use the same test fixture\n");
      std::operator<<(poVar1,"class, so mixing TEST_F and TEST in the same test suite is\n");
      std::operator<<(poVar1,"illegal.  In test suite ");
      local_30 = (pTVar2->test_suite_name_)._M_dataplus._M_p;
      pMVar6 = Message::operator<<((Message *)&local_60,&local_30);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [3])0x14c5bc);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [6])0x14bd2e);
      pMVar6 = Message::operator<<(pMVar6,&TEST_F_name);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [30])" is defined using TEST_F but\n");
      pMVar6 = Message::operator<<(pMVar6,(char (*) [6])0x14bd2e);
      pMVar6 = Message::operator<<(pMVar6,&TEST_name);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [39])" is defined using TEST.  You probably\n");
      pMVar6 = Message::operator<<(pMVar6,(char (*) [62])
                                          "want to change the TEST to TEST_F or move it to another test\n"
                                  );
      pMVar6 = Message::operator<<(pMVar6,(char (*) [6])"case.");
      internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest.cc"
                 ,0x9ca,"Failed");
      internal::AssertHelper::operator=(&local_50,pMVar6);
      internal::AssertHelper::~AssertHelper(&local_50);
    }
    else {
      Message::Message((Message *)&TEST_name);
      poVar1 = (ostream *)(TEST_name + 0x10);
      std::operator<<(poVar1,"All tests in the same test suite must use the same test fixture\n");
      std::operator<<(poVar1,"class.  However, in test suite ");
      TEST_F_name = (pTVar2->test_suite_name_)._M_dataplus._M_p;
      pMVar6 = Message::operator<<((Message *)&TEST_name,&TEST_F_name);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [3])0x14c5bc);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [18])"you defined test ");
      pMVar6 = Message::operator<<(pMVar6,&first_test_name);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [11])" and test ");
      pMVar6 = Message::operator<<(pMVar6,&this_test_name);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [2])0x14c1ca);
      pMVar6 = Message::operator<<(pMVar6,(char (*) [63])
                                          "using two different test fixture classes.  This can happen if\n"
                                  );
      pMVar6 = Message::operator<<(pMVar6,(char (*) [62])
                                          "the two classes are from different namespaces or translation\n"
                                  );
      pMVar6 = Message::operator<<(pMVar6,(char (*) [63])
                                          "units and have the same name.  You should probably rename one\n"
                                  );
      pMVar6 = Message::operator<<(pMVar6,(char (*) [60])
                                          "of the classes to put the tests into different test suites."
                                  );
      internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest.cc"
                 ,0x9d6,"Failed");
      internal::AssertHelper::operator=((AssertHelper *)&local_60,pMVar6);
      internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)TEST_name;
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  return puVar4 == puVar3;
}

Assistant:

bool Test::HasSameFixtureClass() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  const TestSuite* const test_suite = impl->current_test_suite();

  // Info about the first test in the current test suite.
  const TestInfo* const first_test_info = test_suite->test_info_list()[0];
  const internal::TypeId first_fixture_id = first_test_info->fixture_class_id_;
  const char* const first_test_name = first_test_info->name();

  // Info about the current test.
  const TestInfo* const this_test_info = impl->current_test_info();
  const internal::TypeId this_fixture_id = this_test_info->fixture_class_id_;
  const char* const this_test_name = this_test_info->name();

  if (this_fixture_id != first_fixture_id) {
    // Is the first test defined using TEST?
    const bool first_is_TEST = first_fixture_id == internal::GetTestTypeId();
    // Is this test defined using TEST?
    const bool this_is_TEST = this_fixture_id == internal::GetTestTypeId();

    if (first_is_TEST || this_is_TEST) {
      // Both TEST and TEST_F appear in same test suite, which is incorrect.
      // Tell the user how to fix this.

      // Gets the name of the TEST and the name of the TEST_F.  Note
      // that first_is_TEST and this_is_TEST cannot both be true, as
      // the fixture IDs are different for the two tests.
      const char* const TEST_name =
          first_is_TEST ? first_test_name : this_test_name;
      const char* const TEST_F_name =
          first_is_TEST ? this_test_name : first_test_name;

      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class, so mixing TEST_F and TEST in the same test suite is\n"
          << "illegal.  In test suite " << this_test_info->test_suite_name()
          << ",\n"
          << "test " << TEST_F_name << " is defined using TEST_F but\n"
          << "test " << TEST_name << " is defined using TEST.  You probably\n"
          << "want to change the TEST to TEST_F or move it to another test\n"
          << "case.";
    } else {
      // Two fixture classes with the same name appear in two different
      // namespaces, which is not allowed. Tell the user how to fix this.
      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class.  However, in test suite "
          << this_test_info->test_suite_name() << ",\n"
          << "you defined test " << first_test_name << " and test "
          << this_test_name << "\n"
          << "using two different test fixture classes.  This can happen if\n"
          << "the two classes are from different namespaces or translation\n"
          << "units and have the same name.  You should probably rename one\n"
          << "of the classes to put the tests into different test suites.";
    }
    return false;
  }

  return true;
}